

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O3

char * INT_create_transform_action_spec
                 (FMStructDescList format_list,FMStructDescList out_format_list,char *function)

{
  char **ppcVar1;
  char *pcVar2;
  FMStructDescList p_Var3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  
  if (format_list == (FMStructDescList)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0xffffffff;
    p_Var3 = format_list;
    do {
      uVar6 = uVar6 + 1;
      ppcVar1 = &p_Var3->format_name;
      p_Var3 = p_Var3 + 1;
    } while (*ppcVar1 != (char *)0x0);
  }
  pcVar2 = (char *)INT_CMmalloc(0x32);
  sprintf(pcVar2,"Transform Action   Input Format Count %d\n",(ulong)uVar6);
  if (uVar6 != 0) {
    uVar7 = (ulong)uVar6;
    do {
      pcVar2 = add_FMfieldlist_to_string(pcVar2,format_list);
      format_list = format_list + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  uVar7 = 0xffffffffffffffff;
  p_Var3 = out_format_list;
  do {
    uVar7 = uVar7 + 1;
    ppcVar1 = &p_Var3->format_name;
    p_Var3 = p_Var3 + 1;
  } while (*ppcVar1 != (char *)0x0);
  sVar4 = strlen(pcVar2);
  pcVar2 = (char *)INT_CMrealloc(pcVar2,sVar4 + 0x1e);
  sVar4 = strlen(pcVar2);
  sprintf(pcVar2 + sVar4,"  Output Format Count %d\n",uVar7 & 0xffffffff);
  for (; uVar7 != 0; uVar7 = uVar7 - 1) {
    pcVar2 = add_FMfieldlist_to_string(pcVar2,out_format_list);
    out_format_list = out_format_list + 1;
  }
  sVar4 = strlen(pcVar2);
  sVar5 = strlen(function);
  pcVar2 = (char *)INT_CMrealloc(pcVar2,sVar4 + sVar5 + 1);
  sVar4 = strlen(pcVar2);
  strcpy(pcVar2 + sVar4,function);
  return pcVar2;
}

Assistant:

char *
INT_create_transform_action_spec(FMStructDescList format_list, FMStructDescList out_format_list, char *function)
{
    int format_count = 0;
    int i;
    char *str;
    while(format_list && format_list[format_count].format_name != NULL)
	format_count++;
    str = malloc(50);
    sprintf(str, "Transform Action   Input Format Count %d\n", format_count);

    for (i = 0 ; i < format_count; i++) {
	str = add_FMfieldlist_to_string(str, &format_list[i]);
    }

    format_count = 0;
    while(out_format_list[format_count].format_name != NULL) format_count++;
    str = realloc(str, strlen(str) + 30);
    sprintf(str + strlen(str), "  Output Format Count %d\n", format_count);

    for (i = 0 ; i < format_count; i++) {
	str = add_FMfieldlist_to_string(str, &out_format_list[i]);
    }
    str = realloc(str, strlen(str) + strlen(function) + 1);
    strcpy(&str[strlen(str)], function);
    return str;
}